

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

InlineCache * __thiscall
Js::InlineCache::Clone(InlineCache *this,PropertyId propertyId,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  InlineCacheAllocator *pIVar4;
  InlineCache *this_00;
  TrackAllocData local_58;
  InlineCache *local_30;
  InlineCache *clone;
  InlineCacheAllocator *allocator;
  ScriptContext *scriptContext_local;
  InlineCache *pIStack_10;
  PropertyId propertyId_local;
  InlineCache *this_local;
  
  allocator = (InlineCacheAllocator *)scriptContext;
  scriptContext_local._4_4_ = propertyId;
  pIStack_10 = this;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x19c,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pIVar4 = ScriptContext::GetInlineCacheAllocator((ScriptContext *)allocator);
  clone = (InlineCache *)pIVar4;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
             ,0x1a1);
  pIVar4 = (InlineCacheAllocator *)
           Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
           TrackAllocInfo(&pIVar4->
                           super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                          ,&local_58);
  this_00 = (InlineCache *)new<Memory::InlineCacheAllocator>(0x20,pIVar4,0xa3a9c0);
  InlineCache(this_00);
  local_30 = this_00;
  CopyTo(this,scriptContext_local._4_4_,(ScriptContext *)allocator,this_00);
  return local_30;
}

Assistant:

InlineCache *InlineCache::Clone(Js::PropertyId propertyId, ScriptContext* scriptContext)
    {
        Assert(scriptContext);

        InlineCacheAllocator* allocator = scriptContext->GetInlineCacheAllocator();
        // Important to zero the allocated cache to be sure CopyTo doesn't see garbage
        // when it uses the next pointer.
        InlineCache* clone = AllocatorNewZ(InlineCacheAllocator, allocator, InlineCache);
        CopyTo(propertyId, scriptContext, clone);
        return clone;
    }